

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O3

int __thiscall TPZInterpolatedElement::NShapeF(TPZInterpolatedElement *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x90))();
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    iVar4 = 0;
    iVar3 = 0;
    do {
      lVar2 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa8))
                        (this,iVar4);
      iVar3 = iVar3 + *(int *)(lVar2 + 0x18);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  return iVar3;
}

Assistant:

int TPZInterpolatedElement::NShapeF() const {
    int nn = NConnects();
    int in, res = 0;
    for (in = 0; in < nn; in++) {
        TPZConnect &c = Connect(in);
        res += c.NShape();
    }
    return res;
}